

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void nite::print(char *c)

{
  string local_38;
  allocator local_11;
  
  std::__cxx11::string::string((string *)&local_38,c,&local_11);
  print(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void nite::print(const char *c){
		nite::print(String(c));
}